

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QGridLayoutItem_*>::resize_internal(QList<QGridLayoutItem_*> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<QGridLayoutItem_*> *this_00;
  __off_t __length;
  QArrayDataPointer<QGridLayoutItem_*> *in_RSI;
  QArrayDataPointer<QGridLayoutItem_*> *in_RDI;
  QArrayDataPointer<QGridLayoutItem_*> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QGridLayoutItem_*> *this_01;
  QArrayDataPointer<QGridLayoutItem_*> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QGridLayoutItem_*> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QGridLayoutItem_*> *__file;
  
  QArrayDataPointer<QGridLayoutItem_*>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QGridLayoutItem_*>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<QGridLayoutItem_*> *)capacity((QList<QGridLayoutItem_*> *)0x8b9441);
    qVar2 = QArrayDataPointer<QGridLayoutItem_*>::freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QGridLayoutItem_*> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QPodArrayOps<QGridLayoutItem_*> *)
                QArrayDataPointer<QGridLayoutItem_*>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QGridLayoutItem_*>::truncate(this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QGridLayoutItem_*>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (QGridLayoutItem ***)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}